

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplicationPrivate::setActiveWindow(QWidget *act)

{
  bool bVar1;
  int iVar2;
  FocusPolicy FVar3;
  QWidget *pQVar4;
  QGraphicsProxyWidget *pQVar5;
  QStyle *pQVar6;
  QWidget **ppQVar7;
  qsizetype qVar8;
  const_reference ppQVar9;
  QWidget *pQVar10;
  QWidget *pQVar11;
  long in_RDI;
  long in_FS_OFFSET;
  QWidget *w_4;
  QWidget *w_3;
  int i_1;
  QWidget *w_2;
  int i;
  QWidget *w_1;
  QWidgetList *__range3_1;
  QWidget *w;
  QWidgetList *__range3;
  QWidget *window;
  QEvent windowDeactivate;
  QEvent windowActivate;
  QEvent activationChange;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  QWidgetList list_1;
  const_iterator __end3;
  const_iterator __begin3;
  QWidgetList list;
  QWidgetList toBeDeactivated;
  QWidgetList toBeActivated;
  QFocusEvent focusAboutToChange;
  QWidget *in_stack_fffffffffffffea8;
  QList<QWidget_*> *in_stack_fffffffffffffeb0;
  QWidget *in_stack_fffffffffffffeb8;
  QWidget *in_stack_fffffffffffffec0;
  int local_124;
  FocusReason reason;
  QWidget *in_stack_fffffffffffffef0;
  QWidget *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff00;
  undefined1 next;
  QWidget *in_stack_ffffffffffffff08;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  QWidget **local_b0;
  const_iterator local_a8;
  const_iterator local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  QWidget **local_80;
  const_iterator local_78;
  const_iterator local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QList<QWidget_*> local_50;
  QList<QWidget_*> local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = QWidget::window(in_stack_fffffffffffffec0);
  }
  if ((active_window != pQVar4) &&
     ((pQVar4 == (QWidget *)0x0 ||
      (pQVar5 = QWidget::graphicsProxyWidget(in_stack_fffffffffffffea8),
      pQVar5 == (QGraphicsProxyWidget *)0x0)))) {
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QWidget_*>::QList((QList<QWidget_*> *)0x2cda5a);
    local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_50.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QWidget_*>::QList((QList<QWidget_*> *)0x2cda94);
    if (active_window != (QWidget *)0x0) {
      pQVar6 = QApplication::style();
      iVar2 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x17,0,active_window);
      if (iVar2 == 0) {
        QList<QWidget_*>::append((QList<QWidget_*> *)0x2cdc1a,in_stack_fffffffffffffea8);
      }
      else {
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        QApplication::topLevelWidgets();
        in_stack_ffffffffffffff08 = (QWidget *)&local_68;
        local_70.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_70 = QList<QWidget_*>::begin(in_stack_fffffffffffffeb0);
        local_78.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = QList<QWidget_*>::end(in_stack_fffffffffffffeb0);
        while( true ) {
          local_80 = local_78.i;
          bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_70,local_78);
          if (!bVar1) break;
          ppQVar7 = QList<QWidget_*>::const_iterator::operator*(&local_70);
          in_stack_ffffffffffffff00 = *ppQVar7;
          bVar1 = QWidget::isVisible((QWidget *)0x2cdbb8);
          if ((bVar1) && (bVar1 = QWidget::isActiveWindow(in_stack_fffffffffffffef8), bVar1)) {
            QList<QWidget_*>::append((QList<QWidget_*> *)0x2cdbe0,in_stack_fffffffffffffea8);
          }
          QList<QWidget_*>::const_iterator::operator++(&local_70);
        }
        QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cdc01);
      }
    }
    if (focus_widget != (QWidget *)0x0) {
      bVar1 = QWidget::testAttribute
                        (in_stack_fffffffffffffeb8,
                         (WidgetAttribute)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
      if (bVar1) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
      }
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QFocusEvent::QFocusEvent((QFocusEvent *)&local_20,FocusAboutToChange,ActiveWindowFocusReason);
      QCoreApplication::sendEvent(&focus_widget->super_QObject,(QEvent *)&local_20);
      QFocusEvent::~QFocusEvent((QFocusEvent *)&local_20);
    }
    active_window = pQVar4;
    if (pQVar4 != (QWidget *)0x0) {
      pQVar6 = QApplication::style();
      iVar2 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x17,0,active_window);
      if (iVar2 == 0) {
        QList<QWidget_*>::append((QList<QWidget_*> *)0x2cde51,in_stack_fffffffffffffea8);
      }
      else {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        QApplication::topLevelWidgets();
        in_stack_fffffffffffffef8 = (QWidget *)&local_98;
        local_a0.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_a0 = QList<QWidget_*>::begin(in_stack_fffffffffffffeb0);
        local_a8.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_a8 = QList<QWidget_*>::end(in_stack_fffffffffffffeb0);
        while( true ) {
          local_b0 = local_a8.i;
          bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_a0,local_a8);
          if (!bVar1) break;
          ppQVar7 = QList<QWidget_*>::const_iterator::operator*(&local_a0);
          in_stack_fffffffffffffef0 = *ppQVar7;
          bVar1 = QWidget::isVisible((QWidget *)0x2cddef);
          if ((bVar1) && (bVar1 = QWidget::isActiveWindow(in_stack_fffffffffffffef8), bVar1)) {
            QList<QWidget_*>::append((QList<QWidget_*> *)0x2cde17,in_stack_fffffffffffffea8);
          }
          QList<QWidget_*>::const_iterator::operator++(&local_a0);
        }
        QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cde38);
      }
    }
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_c0,ActivationChange);
    local_d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_d0,WindowActivate);
    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_e0,WindowDeactivate);
    reason = MouseFocusReason;
    while( true ) {
      pQVar4 = (QWidget *)(long)(int)reason;
      qVar8 = QList<QWidget_*>::size(&local_38);
      if (qVar8 <= (long)pQVar4) break;
      ppQVar9 = QList<QWidget_*>::at(in_stack_fffffffffffffeb0,(qsizetype)in_stack_fffffffffffffea8)
      ;
      pQVar4 = *ppQVar9;
      QCoreApplication::sendSpontaneousEvent(&pQVar4->super_QObject,(QEvent *)&local_d0);
      QCoreApplication::sendSpontaneousEvent(&pQVar4->super_QObject,(QEvent *)&local_c0);
      reason = reason + TabFocusReason;
    }
    local_124 = 0;
    while( true ) {
      pQVar10 = (QWidget *)(long)local_124;
      qVar8 = QList<QWidget_*>::size(&local_50);
      next = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
      if (qVar8 <= (long)pQVar10) break;
      ppQVar9 = QList<QWidget_*>::at
                          ((QList<QWidget_*> *)pQVar10,(qsizetype)in_stack_fffffffffffffea8);
      pQVar10 = *ppQVar9;
      QCoreApplication::sendSpontaneousEvent(&pQVar10->super_QObject,(QEvent *)&local_e0);
      QCoreApplication::sendSpontaneousEvent(&pQVar10->super_QObject,(QEvent *)&local_c0);
      local_124 = local_124 + 1;
    }
    bVar1 = inPopupMode();
    if (!bVar1) {
      if ((active_window == (QWidget *)0x0) && (focus_widget != (QWidget *)0x0)) {
        setFocusWidget(pQVar4,(FocusReason)((ulong)pQVar10 >> 0x20));
      }
      else if (active_window != (QWidget *)0x0) {
        pQVar11 = QWidget::focusWidget((QWidget *)0x2ce022);
        if ((pQVar11 == (QWidget *)0x0) || (bVar1 = QWidget::isVisible((QWidget *)0x2ce039), !bVar1)
           ) {
          pQVar11 = focusNextPrevChild_helper
                              (in_stack_ffffffffffffff08,(bool)next,
                               (bool *)in_stack_fffffffffffffef8);
          if (pQVar11 == (QWidget *)0x0) {
            if ((focus_widget == (QWidget *)0x0) &&
               (FVar3 = QWidget::focusPolicy(active_window), FVar3 != NoFocus)) {
              QWidget::setFocus(in_stack_fffffffffffffef0,reason);
            }
            else {
              bVar1 = QWidget::isAncestorOf(pQVar4,pQVar10);
              if (!bVar1) {
                setFocusWidget(pQVar4,(FocusReason)((ulong)pQVar10 >> 0x20));
              }
            }
          }
          else {
            QWidget::setFocus(in_stack_fffffffffffffef0,reason);
          }
        }
        else {
          QWidget::setFocus(in_stack_fffffffffffffef0,reason);
        }
      }
    }
    QEvent::~QEvent((QEvent *)&local_e0);
    QEvent::~QEvent((QEvent *)&local_d0);
    QEvent::~QEvent((QEvent *)&local_c0);
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2ce12d);
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2ce13a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::setActiveWindow(QWidget* act)
{
    QWidget* window = act?act->window():nullptr;

    if (QApplicationPrivate::active_window == window)
        return;

#if QT_CONFIG(graphicsview)
    if (window && window->graphicsProxyWidget()) {
        // Activate the proxy's view->viewport() ?
        return;
    }
#endif

    QWidgetList toBeActivated;
    QWidgetList toBeDeactivated;

    if (QApplicationPrivate::active_window) {
        if (QApplication::style()->styleHint(QStyle::SH_Widget_ShareActivation, nullptr, QApplicationPrivate::active_window)) {
            const QWidgetList list = QApplication::topLevelWidgets();
            for (auto *w : list) {
                if (w->isVisible() && w->isActiveWindow())
                    toBeDeactivated.append(w);
            }
        } else {
            toBeDeactivated.append(QApplicationPrivate::active_window);
        }
    }

    if (QApplicationPrivate::focus_widget) {
        if (QApplicationPrivate::focus_widget->testAttribute(Qt::WA_InputMethodEnabled))
            QGuiApplication::inputMethod()->commit();

        QFocusEvent focusAboutToChange(QEvent::FocusAboutToChange, Qt::ActiveWindowFocusReason);
        QCoreApplication::sendEvent(QApplicationPrivate::focus_widget, &focusAboutToChange);
    }

    QApplicationPrivate::active_window = window;

    if (QApplicationPrivate::active_window) {
        if (QApplication::style()->styleHint(QStyle::SH_Widget_ShareActivation, nullptr, QApplicationPrivate::active_window)) {
            const QWidgetList list = QApplication::topLevelWidgets();
            for (auto *w : list) {
                if (w->isVisible() && w->isActiveWindow())
                    toBeActivated.append(w);
            }
        } else {
            toBeActivated.append(QApplicationPrivate::active_window);
        }

    }

    // first the activation/deactivation events
    QEvent activationChange(QEvent::ActivationChange);
    QEvent windowActivate(QEvent::WindowActivate);
    QEvent windowDeactivate(QEvent::WindowDeactivate);

    for (int i = 0; i < toBeActivated.size(); ++i) {
        QWidget *w = toBeActivated.at(i);
        QApplication::sendSpontaneousEvent(w, &windowActivate);
        QApplication::sendSpontaneousEvent(w, &activationChange);
    }

    for(int i = 0; i < toBeDeactivated.size(); ++i) {
        QWidget *w = toBeDeactivated.at(i);
        QApplication::sendSpontaneousEvent(w, &windowDeactivate);
        QApplication::sendSpontaneousEvent(w, &activationChange);
    }

    if (!inPopupMode()) {
        // then focus events
        if (!QApplicationPrivate::active_window && QApplicationPrivate::focus_widget) {
            QApplicationPrivate::setFocusWidget(nullptr, Qt::ActiveWindowFocusReason);
        } else if (QApplicationPrivate::active_window) {
            QWidget *w = QApplicationPrivate::active_window->focusWidget();
            if (w && w->isVisible() /*&& w->focusPolicy() != QWidget::NoFocus*/)
                w->setFocus(Qt::ActiveWindowFocusReason);
            else {
                w = QApplicationPrivate::focusNextPrevChild_helper(QApplicationPrivate::active_window, true);
                if (w) {
                    w->setFocus(Qt::ActiveWindowFocusReason);
                } else {
                    w = QApplicationPrivate::focus_widget;
                    if (!w && QApplicationPrivate::active_window->focusPolicy() != Qt::NoFocus) {
                        QApplicationPrivate::active_window->setFocus(Qt::ActiveWindowFocusReason);
                    } else if (!QApplicationPrivate::active_window->isAncestorOf(w)) {
                        // If the focus widget is not in the activate_window, clear the focus
                        QApplicationPrivate::setFocusWidget(nullptr, Qt::ActiveWindowFocusReason);
                    }
                }
            }
        }
    }
}